

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void windowAggStep(Parse *pParse,Window *pMWin,int csr,int bInverse,int reg)

{
  FuncDef *p;
  ExprList *pEVar1;
  int p3;
  byte bVar2;
  int iVar3;
  ExprList *pList;
  Vdbe *p_00;
  CollSeq *zP4;
  u8 uVar4;
  int p2;
  Op *pOVar5;
  int iVar6;
  int iVar7;
  Window *pWVar8;
  int local_50;
  
  p_00 = sqlite3GetVdbe(pParse);
  if (pMWin != (Window *)0x0) {
    pWVar8 = pMWin;
    do {
      p = pWVar8->pFunc;
      pEVar1 = (pWVar8->pOwner->x).pList;
      iVar3 = 0;
      if ((pEVar1 != (ExprList *)0x0) && (iVar3 = pEVar1->nExpr, 0 < iVar3)) {
        iVar7 = 0;
        do {
          if ((iVar7 == 1) && (p->zName == "nth_value")) {
            iVar6 = pMWin->iEphCsr;
            p2 = pWVar8->iArgCol + 1;
            p3 = reg + 1;
          }
          else {
            p2 = pWVar8->iArgCol + iVar7;
            iVar6 = csr;
            p3 = reg + iVar7;
          }
          sqlite3VdbeAddOp3(p_00,0x5a,iVar6,p2,p3);
          iVar7 = iVar7 + 1;
        } while (iVar3 != iVar7);
      }
      if (((pMWin->regStartRowid == 0) && ((p->funcFlags & 0x1000) != 0)) && (pWVar8->eStart != 'W')
         ) {
        iVar3 = sqlite3VdbeAddOp3(p_00,0x32,reg,0,0);
        if (bInverse == 0) {
          sqlite3VdbeAddOp3(p_00,0x53,pWVar8->regApp + 1,1,0);
          sqlite3VdbeAddOp3(p_00,0x4f,reg,pWVar8->regApp,0);
          sqlite3VdbeAddOp3(p_00,0x5c,pWVar8->regApp,2,pWVar8->regApp + 2);
          sqlite3VdbeAddOp3(p_00,0x84,pWVar8->csrApp,pWVar8->regApp + 2,0);
          iVar7 = p_00->nOp;
          uVar4 = p_00->db->mallocFailed;
        }
        else {
          iVar7 = sqlite3VdbeAddOp3(p_00,0x18,pWVar8->csrApp,0,reg);
          if (p_00->db->mallocFailed == '\0') {
            pOVar5 = p_00->aOp;
            pOVar5[iVar7].p4type = -3;
            pOVar5[iVar7].p4.i = 1;
          }
          sqlite3VdbeAddOp3(p_00,0x7b,pWVar8->csrApp,0,0);
          iVar7 = p_00->nOp;
          uVar4 = p_00->db->mallocFailed;
          pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (uVar4 == '\0') {
            pOVar5 = p_00->aOp + (int)((iVar7 < 2 | 0xfffffffe) + iVar7);
          }
          pOVar5->p2 = iVar7;
        }
        pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (uVar4 == '\0') {
          iVar6 = iVar7 + -1;
          if (-1 < iVar3) {
            iVar6 = iVar3;
          }
          pOVar5 = p_00->aOp + iVar6;
        }
        pOVar5->p2 = iVar7;
      }
      else if (pWVar8->regApp == 0) {
        if (p->xSFunc != noopStepFunc) {
          if (pWVar8->pFilter == (Expr *)0x0) {
            local_50 = 0;
          }
          else {
            if (pParse->nTempReg == '\0') {
              iVar7 = pParse->nMem + 1;
              pParse->nMem = iVar7;
            }
            else {
              bVar2 = pParse->nTempReg - 1;
              pParse->nTempReg = bVar2;
              iVar7 = pParse->aTempReg[bVar2];
            }
            sqlite3VdbeAddOp3(p_00,0x5a,csr,pWVar8->iArgCol + iVar3,iVar7);
            local_50 = sqlite3VdbeAddOp3(p_00,0x14,iVar7,0,1);
            if (iVar7 != 0) {
              bVar2 = pParse->nTempReg;
              if ((ulong)bVar2 < 8) {
                pParse->nTempReg = bVar2 + 1;
                pParse->aTempReg[bVar2] = iVar7;
              }
            }
          }
          if ((p->funcFlags & 0x20) != 0) {
            zP4 = sqlite3ExprCollSeq(pParse,((pWVar8->pOwner->x).pList)->a[0].pExpr);
            if (zP4 == (CollSeq *)0x0) {
              zP4 = pParse->db->pDfltColl;
            }
            iVar7 = sqlite3VdbeAddOp3(p_00,0x52,0,0,0);
            sqlite3VdbeChangeP4(p_00,iVar7,(char *)zP4,-2);
          }
          sqlite3VdbeAddOp3(p_00,(bInverse == 0) + 0x99,bInverse,reg,pWVar8->regAccum);
          if (p_00->db->mallocFailed == '\0') {
            pOVar5 = p_00->aOp;
            iVar7 = p_00->nOp;
            pOVar5[(long)iVar7 + -1].p4type = -8;
            pOVar5[(long)iVar7 + -1].p4.pKeyInfo = (KeyInfo *)p;
          }
          else if ((p->funcFlags & 0x10) != 0) {
            sqlite3DbFreeNN(p_00->db,p);
          }
          iVar7 = p_00->nOp;
          if (0 < (long)iVar7) {
            p_00->aOp[(long)iVar7 + -1].p5 = (ushort)iVar3 & 0xff;
          }
          if (local_50 != 0) {
            pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (p_00->db->mallocFailed == '\0') {
              iVar3 = iVar7 + -1;
              if (-1 < local_50) {
                iVar3 = local_50;
              }
              pOVar5 = p_00->aOp + iVar3;
            }
            pOVar5->p2 = iVar7;
          }
        }
      }
      else {
        sqlite3VdbeAddOp3(p_00,0x53,(pWVar8->regApp - bInverse) + 1,1,0);
      }
      pWVar8 = pWVar8->pNextWin;
    } while (pWVar8 != (Window *)0x0);
  }
  return;
}

Assistant:

static void windowAggStep(
  Parse *pParse, 
  Window *pMWin,                  /* Linked list of window functions */
  int csr,                        /* Read arguments from this cursor */
  int bInverse,                   /* True to invoke xInverse instead of xStep */
  int reg                         /* Array of registers */
){
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;
  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *pFunc = pWin->pFunc;
    int regArg;
    int nArg = windowArgCount(pWin);
    int i;

    for(i=0; i<nArg; i++){
      if( i!=1 || pFunc->zName!=nth_valueName ){
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+i, reg+i);
      }else{
        sqlite3VdbeAddOp3(v, OP_Column, pMWin->iEphCsr, pWin->iArgCol+i, reg+i);
      }
    }
    regArg = reg;

    if( pMWin->regStartRowid==0
     && (pFunc->funcFlags & SQLITE_FUNC_MINMAX) 
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      int addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regArg);
      VdbeCoverage(v);
      if( bInverse==0 ){
        sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1, 1);
        sqlite3VdbeAddOp2(v, OP_SCopy, regArg, pWin->regApp);
        sqlite3VdbeAddOp3(v, OP_MakeRecord, pWin->regApp, 2, pWin->regApp+2);
        sqlite3VdbeAddOp2(v, OP_IdxInsert, pWin->csrApp, pWin->regApp+2);
      }else{
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, pWin->csrApp, 0, regArg, 1);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp1(v, OP_Delete, pWin->csrApp);
        sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      }
      sqlite3VdbeJumpHere(v, addrIsNull);
    }else if( pWin->regApp ){
      assert( pFunc->zName==nth_valueName
           || pFunc->zName==first_valueName
      );
      assert( bInverse==0 || bInverse==1 );
      sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1-bInverse, 1);
    }else if( pFunc->xSFunc!=noopStepFunc ){
      int addrIf = 0;
      if( pWin->pFilter ){
        int regTmp;
        assert( nArg==0 || nArg==pWin->pOwner->x.pList->nExpr );
        assert( nArg || pWin->pOwner->x.pList==0 );
        regTmp = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+nArg,regTmp);
        addrIf = sqlite3VdbeAddOp3(v, OP_IfNot, regTmp, 0, 1);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, regTmp);
      }
      if( pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        CollSeq *pColl;
        assert( nArg>0 );
        pColl = sqlite3ExprNNCollSeq(pParse, pWin->pOwner->x.pList->a[0].pExpr);
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0,0,0, (const char*)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp3(v, bInverse? OP_AggInverse : OP_AggStep, 
                        bInverse, regArg, pWin->regAccum);
      sqlite3VdbeAppendP4(v, pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u8)nArg);
      if( addrIf ) sqlite3VdbeJumpHere(v, addrIf);
    }
  }
}